

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int arkReplaceAdaptController(ARKodeMem ark_mem,SUNAdaptController C,int take_ownership)

{
  int iVar1;
  int in_EDX;
  SUNAdaptController in_RSI;
  ARKodeMem in_RDI;
  long leniw;
  long lenrw;
  int retval;
  SUNContext_conflict in_stack_ffffffffffffffd0;
  long local_28;
  int local_20;
  int local_1c;
  SUNAdaptController local_18;
  ARKodeMem local_10;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI->hadapt_mem->owncontroller != 0) &&
     (in_RDI->hadapt_mem->hcontroller != (SUNAdaptController)0x0)) {
    local_20 = SUNAdaptController_Space
                         (in_RDI->hadapt_mem->hcontroller,&local_28,&stack0xffffffffffffffd0);
    if (local_20 == 0) {
      local_10->liw = local_10->liw - (long)in_stack_ffffffffffffffd0;
      local_10->lrw = local_10->lrw - local_28;
    }
    local_20 = SUNAdaptController_Destroy(local_10->hadapt_mem->hcontroller);
    local_10->hadapt_mem->owncontroller = 0;
    if (local_20 != 0) {
      arkProcessError(local_10,-0x14,0xd00,"arkReplaceAdaptController",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"SUNAdaptController_Destroy failure");
      return -0x14;
    }
    local_20 = 0;
  }
  local_10->hadapt_mem->hcontroller = (SUNAdaptController)0x0;
  if (local_18 == (SUNAdaptController)0x0) {
    local_18 = SUNAdaptController_I(in_stack_ffffffffffffffd0);
    if (local_18 == (SUNAdaptController)0x0) {
      arkProcessError(local_10,-0x14,0xd0d,"arkReplaceAdaptController",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"SUNAdaptController_I allocation failure");
      return -0x14;
    }
    local_10->hadapt_mem->owncontroller = 1;
  }
  else {
    local_10->hadapt_mem->owncontroller = local_1c;
  }
  iVar1 = SUNAdaptController_Space(local_18,&local_28,&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    local_10->liw = (long)&in_stack_ffffffffffffffd0->profiler + local_10->liw;
    local_10->lrw = local_28 + local_10->lrw;
  }
  local_10->hadapt_mem->hcontroller = local_18;
  return 0;
}

Assistant:

int arkReplaceAdaptController(ARKodeMem ark_mem, SUNAdaptController C,
                              sunbooleantype take_ownership)
{
  int retval;
  long int lenrw, leniw;

  /* Remove current SUNAdaptController object
     (delete if owned, and then nullify pointer) */
  if (ark_mem->hadapt_mem->owncontroller &&
      (ark_mem->hadapt_mem->hcontroller != NULL))
  {
    retval = SUNAdaptController_Space(ark_mem->hadapt_mem->hcontroller, &lenrw,
                                      &leniw);
    if (retval == SUN_SUCCESS)
    {
      ark_mem->liw -= leniw;
      ark_mem->lrw -= lenrw;
    }

    retval = SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
    ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_Destroy failure");
      return (ARK_MEM_FAIL);
    }
  }
  ark_mem->hadapt_mem->hcontroller = NULL;

  /* On NULL-valued input, create default SUNAdaptController object */
  if (C == NULL)
  {
    C = SUNAdaptController_I(ark_mem->sunctx);
    if (C == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "SUNAdaptController_I allocation failure");
      return (ARK_MEM_FAIL);
    }
    ark_mem->hadapt_mem->owncontroller = SUNTRUE;
  }
  else { ark_mem->hadapt_mem->owncontroller = take_ownership; }

  /* Attach new SUNAdaptController object */
  retval = SUNAdaptController_Space(C, &lenrw, &leniw);
  if (retval == SUN_SUCCESS)
  {
    ark_mem->liw += leniw;
    ark_mem->lrw += lenrw;
  }
  ark_mem->hadapt_mem->hcontroller = C;

  return (ARK_SUCCESS);
}